

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O0

int __thiscall
cmCommandArgumentParserHelper::ParseString(cmCommandArgumentParserHelper *this,char *str,int verb)

{
  int iVar1;
  ostream *poVar2;
  yyscan_t pvStack_30;
  int res;
  yyscan_t yyscanner;
  char *pcStack_20;
  int verb_local;
  char *str_local;
  cmCommandArgumentParserHelper *this_local;
  
  if (str == (char *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    this->Verbose = verb;
    yyscanner._4_4_ = verb;
    pcStack_20 = str;
    str_local = (char *)this;
    std::__cxx11::string::operator=((string *)&this->InputBuffer,str);
    this->InputBufferPos = 0;
    this->CurrentLine = 0;
    std::__cxx11::string::clear();
    cmCommandArgument_yylex_init(&stack0xffffffffffffffd0);
    cmCommandArgument_yyset_extra((cmListFileLexer *)this,pvStack_30);
    cmCommandArgument_SetupEscapes(pvStack_30,(bool)(this->NoEscapeMode & 1));
    iVar1 = cmCommandArgument_yyparse(pvStack_30);
    cmCommandArgument_yylex_destroy(pvStack_30);
    if (iVar1 == 0) {
      CleanupParser(this);
      if (this->Verbose != 0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Expanding [");
        poVar2 = std::operator<<(poVar2,pcStack_20);
        poVar2 = std::operator<<(poVar2,"] produced: [");
        poVar2 = std::operator<<(poVar2,(string *)&this->Result);
        poVar2 = std::operator<<(poVar2,"]");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int cmCommandArgumentParserHelper::ParseString(const char* str, int verb)
{
  if (!str) {
    return 0;
  }
  this->Verbose = verb;
  this->InputBuffer = str;
  this->InputBufferPos = 0;
  this->CurrentLine = 0;

  this->Result.clear();

  yyscan_t yyscanner;
  cmCommandArgument_yylex_init(&yyscanner);
  cmCommandArgument_yyset_extra(this, yyscanner);
  cmCommandArgument_SetupEscapes(yyscanner, this->NoEscapeMode);
  int res = cmCommandArgument_yyparse(yyscanner);
  cmCommandArgument_yylex_destroy(yyscanner);
  if (res != 0) {
    return 0;
  }

  this->CleanupParser();

  if (Verbose) {
    std::cerr << "Expanding [" << str << "] produced: [" << this->Result << "]"
              << std::endl;
  }
  return 1;
}